

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void Hex::Hexdumper<char>::output_asc_padding(ostream *os,int n)

{
  string padding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_38,(long)n,' ');
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void output_asc_padding(std::ostream& os, int n)
    {
        int oneunit = sizeof(T);
        std::string padding(n*oneunit, ' ');
        os << padding;
    }